

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O1

void __thiscall FIX::Session::next(Session *this,Message *message,UtcTimeStamp *now,bool queued)

{
  pointer pcVar1;
  FieldMap *this_00;
  bool bVar2;
  int iVar3;
  FieldBase *pFVar4;
  FieldBase *this_01;
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  _Var5;
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  _Var6;
  DataDictionary *pSessionDD;
  DataDictionary *pAppDD;
  SEQNUM num;
  FieldNotFound *pFVar7;
  UnsupportedVersion *this_02;
  long *plVar8;
  char *pcVar9;
  long lVar10;
  undefined7 in_register_00000009;
  UtcTimeStamp *now_00;
  UtcTimeStamp *now_01;
  UtcTimeStamp *now_02;
  UtcTimeStamp *now_03;
  uchar *in_R8;
  size_t in_R9;
  string *psVar11;
  undefined1 auVar12 [12];
  ApplVerID applVerID;
  allocator<char> local_a9;
  undefined8 local_a8;
  undefined4 local_9c;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  char local_78 [16];
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  field_metrics local_48;
  FieldMap *local_40;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000009,queued);
  local_40 = &(message->m_header).super_FieldMap;
  bVar2 = checkSessionTime(this,now);
  this_00 = local_40;
  if (bVar2) {
    pFVar4 = FieldMap::getFieldRef(local_40,0x23);
    this_01 = FieldMap::getFieldRef(this_00,8);
    _Var5 = FieldMap::
            lookup<__gnu_cxx::__normal_iterator<FIX::FieldBase_const*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>>
                      (local_40,(message->m_header).super_FieldMap.m_fields.
                                super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                       (message->m_header).super_FieldMap.m_fields.
                       super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
                       super__Vector_impl_data._M_finish,0x31);
    _Var6._M_current =
         (message->m_header).super_FieldMap.m_fields.
         super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (_Var5._M_current == _Var6._M_current) {
      pFVar7 = (FieldNotFound *)__cxa_allocate_exception(0x58);
      local_98._0_8_ = local_98 + 0x10;
      local_98._8_8_ = 0;
      local_88._M_allocated_capacity = local_88._M_allocated_capacity & 0xffffffffffffff00;
      local_9c = (undefined4)CONCAT71((int7)((ulong)pFVar7 >> 8),1);
      FieldNotFound::FieldNotFound(pFVar7,0x31,(string *)local_98);
      local_9c = 0;
      __cxa_throw(pFVar7,&FieldNotFound::typeinfo,FIX::Exception::~Exception);
    }
    _Var6 = FieldMap::
            lookup<__gnu_cxx::__normal_iterator<FIX::FieldBase_const*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>>
                      (local_40,(message->m_header).super_FieldMap.m_fields.
                                super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
                                _M_impl.super__Vector_impl_data._M_start,_Var6,0x38);
    if (_Var6._M_current ==
        (message->m_header).super_FieldMap.m_fields.
        super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pFVar7 = (FieldNotFound *)__cxa_allocate_exception(0x58);
      local_98._0_8_ = local_98 + 0x10;
      local_98._8_8_ = 0;
      local_88._M_allocated_capacity = local_88._M_allocated_capacity & 0xffffffffffffff00;
      local_9c = (undefined4)CONCAT71((int7)((ulong)pFVar7 >> 8),1);
      FieldNotFound::FieldNotFound(pFVar7,0x38,(string *)local_98);
      local_9c = 0;
      __cxa_throw(pFVar7,&FieldNotFound::typeinfo,FIX::Exception::~Exception);
    }
    bVar2 = StringField::operator!=((StringField *)this_01,(StringField *)&this->m_sessionID);
    if (bVar2) {
      this_02 = (UnsupportedVersion *)__cxa_allocate_exception(0x50);
      local_98._0_8_ = local_98 + 0x10;
      local_98._8_8_ = 0;
      local_88._M_allocated_capacity = local_88._M_allocated_capacity & 0xffffffffffffff00;
      local_9c = (undefined4)CONCAT71((int7)((ulong)this_02 >> 8),1);
      UnsupportedVersion::UnsupportedVersion(this_02,(string *)local_98);
      local_9c = 0;
      __cxa_throw(this_02,&UnsupportedVersion::typeinfo,FIX::Exception::~Exception);
    }
    psVar11 = &pFVar4->m_string;
    iVar3 = std::__cxx11::string::compare((char *)psVar11);
    if (iVar3 == 0) {
      if ((this->m_sessionID).m_isFIXT == true) {
        FieldMap::getFieldRef(&message->super_FieldMap,0x471);
        std::__cxx11::string::_M_assign((string *)&this->m_targetDefaultApplVerID);
      }
      else {
        Message::toApplVerID((ApplVerID *)local_98,(BeginString *)this_01);
        std::__cxx11::string::_M_assign((string *)&this->m_targetDefaultApplVerID);
        FieldBase::~FieldBase((FieldBase *)local_98);
      }
    }
    pSessionDD = DataDictionaryProvider::getSessionDataDictionary
                           (&this->m_dataDictionaryProvider,&(this->m_sessionID).m_beginString);
    if (((this->m_sessionID).m_isFIXT == true) && (bVar2 = Message::isApp(message), bVar2)) {
      local_98._0_8_ = &PTR__FieldBase_001f8470;
      local_98._8_4_ = 0x468;
      local_88._M_allocated_capacity = (size_type)local_78;
      pcVar1 = (this->m_targetDefaultApplVerID)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_98 + 0x10),pcVar1,
                 pcVar1 + (this->m_targetDefaultApplVerID)._M_string_length);
      local_68._M_p = (pointer)&local_58;
      local_60 = 0;
      local_58._M_local_buf[0] = '\0';
      local_48.m_length = 0;
      local_48.m_checksum = 0;
      local_98._0_8_ = &PTR__FieldBase_001f9f80;
      FieldMap::getFieldIfSet(local_40,(FieldBase *)local_98);
      pAppDD = DataDictionaryProvider::getApplicationDataDictionary
                         (&this->m_dataDictionaryProvider,(ApplVerID *)local_98);
      DataDictionary::validate(message,pSessionDD,pAppDD);
      FieldBase::~FieldBase((FieldBase *)local_98);
    }
    else {
      DataDictionary::validate(message,pSessionDD,pSessionDD);
    }
    iVar3 = std::__cxx11::string::compare((char *)psVar11);
    if (iVar3 == 0) {
      nextLogon(this,message,now);
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)psVar11);
      if (iVar3 == 0) {
        nextHeartbeat(this,message,now);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)psVar11);
        if (iVar3 == 0) {
          nextTestRequest(this,message,now);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)psVar11);
          if (iVar3 == 0) {
            nextSequenceReset(this,message,now_00);
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)psVar11);
            if (iVar3 == 0) {
              nextLogout(this,message,now_01);
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)psVar11);
              if (iVar3 == 0) {
                nextResendRequest(this,message,now_02);
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)psVar11);
                if (iVar3 == 0) {
                  nextReject(this,message,now);
                }
                else {
                  iVar3 = verify(this,(EVP_PKEY_CTX *)message,(uchar *)0x1,1,in_R8,in_R9);
                  if ((char)iVar3 == '\0') {
                    return;
                  }
                  SessionState::incrNextTargetMsgSeqNum(&this->m_state);
                }
              }
            }
          }
        }
      }
    }
    while( true ) {
      if ((char)local_34 == '\0') {
        do {
          num = SessionState::getNextTargetMsgSeqNum(&this->m_state);
          bVar2 = nextQueued(this,num,now);
        } while (bVar2);
      }
      if ((this->m_state).m_receivedLogon != true) {
        return;
      }
      if (((this->m_state).m_sentLogon & 1U) == 0) {
        return;
      }
      if ((this->m_timestamper).super__Function_base._M_manager != (_Manager_type)0x0) break;
      auVar12 = std::__throw_bad_function_call();
      iVar3 = auVar12._8_4_;
      local_a8 = auVar12._0_8_;
      FieldBase::~FieldBase((FieldBase *)local_98);
      if (iVar3 == 0x11) {
        plVar8 = (long *)__cxa_begin_catch(local_a8);
        pcVar9 = (char *)(**(code **)(*plVar8 + 0x10))(plVar8);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_98,pcVar9,&local_a9);
        SessionState::onEvent(&this->m_state,(string *)local_98);
LAB_001ae88a:
        if ((Message *)local_98._0_8_ != (Message *)(local_98 + 0x10)) {
LAB_001ae898:
          operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
        }
      }
      else if (iVar3 == 0x10) {
        lVar10 = __cxa_begin_catch(local_a8);
        generateReject(this,message,1,*(int *)(lVar10 + 0x50));
      }
      else if (iVar3 == 0xf) {
        lVar10 = __cxa_begin_catch(local_a8);
        pFVar4 = FieldMap::getFieldRef(local_40,8);
        iVar3 = std::__cxx11::string::compare((char *)&pFVar4->m_string);
        if ((iVar3 < 0) || (bVar2 = Message::isApp(message), !bVar2)) {
          generateReject(this,message,1,*(int *)(lVar10 + 0x50));
          pFVar4 = FieldMap::getFieldRef(local_40,0x23);
          iVar3 = std::__cxx11::string::compare((char *)&pFVar4->m_string);
          if (iVar3 == 0) {
            local_98._0_8_ = (Message *)(local_98 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_98,"Required field missing from logon","");
            SessionState::onEvent(&this->m_state,(string *)local_98);
            if ((Message *)local_98._0_8_ != (Message *)(local_98 + 0x10)) {
              operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
            }
            disconnect(this);
          }
        }
        else {
          generateBusinessReject(this,message,5,*(int *)(lVar10 + 0x50));
        }
      }
      else if (iVar3 == 0xe) {
        lVar10 = __cxa_begin_catch(local_a8);
        generateReject(this,message,0,*(int *)(lVar10 + 0x50));
      }
      else if (iVar3 == 0xd) {
        lVar10 = __cxa_begin_catch(local_a8);
        generateReject(this,message,4,*(int *)(lVar10 + 0x50));
      }
      else if (iVar3 == 0xc) {
        lVar10 = __cxa_begin_catch(local_a8);
        generateReject(this,message,2,*(int *)(lVar10 + 0x50));
      }
      else if (iVar3 == 0xb) {
        __cxa_begin_catch(local_a8);
        generateReject(this,message,0xb,0);
      }
      else if (iVar3 == 10) {
        __cxa_begin_catch(local_a8);
        pFVar4 = FieldMap::getFieldRef(local_40,8);
        iVar3 = std::__cxx11::string::compare((char *)&pFVar4->m_string);
        if (iVar3 < 0) {
          local_98._0_8_ = (Message *)(local_98 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_98,"Unsupported message type","");
          generateReject(this,message,(string *)local_98);
          if ((Message *)local_98._0_8_ != (Message *)(local_98 + 0x10)) goto LAB_001ae898;
        }
        else {
          generateBusinessReject(this,message,3,0);
        }
      }
      else if (iVar3 == 9) {
        lVar10 = __cxa_begin_catch(local_a8);
        generateReject(this,message,0xe,*(int *)(lVar10 + 0x50));
      }
      else if (iVar3 == 8) {
        lVar10 = __cxa_begin_catch(local_a8);
        generateReject(this,message,6,*(int *)(lVar10 + 0x50));
      }
      else if (iVar3 == 7) {
        lVar10 = __cxa_begin_catch(local_a8);
        generateReject(this,message,5,*(int *)(lVar10 + 0x50));
      }
      else if (iVar3 == 6) {
        lVar10 = __cxa_begin_catch(local_a8);
        generateReject(this,message,0xd,*(int *)(lVar10 + 0x50));
      }
      else if (iVar3 == 5) {
        lVar10 = __cxa_begin_catch(local_a8);
        generateReject(this,message,0x10,*(int *)(lVar10 + 0x50));
      }
      else {
        if (iVar3 == 4) {
          plVar8 = (long *)__cxa_begin_catch(local_a8);
          pcVar9 = (char *)(**(code **)(*plVar8 + 0x10))(plVar8);
          std::__cxx11::string::string<std::allocator<char>>((string *)local_98,pcVar9,&local_a9);
          SessionState::onEvent(&this->m_state,(string *)local_98);
          goto LAB_001ae88a;
        }
        if (iVar3 == 3) {
          plVar8 = (long *)__cxa_begin_catch(local_a8);
          pcVar9 = (char *)(**(code **)(*plVar8 + 0x10))(plVar8);
          std::__cxx11::string::string<std::allocator<char>>((string *)local_98,pcVar9,&local_a9);
          SessionState::onEvent(&this->m_state,(string *)local_98);
          message = (Message *)(local_98 + 0x10);
          if ((Message *)local_98._0_8_ != message) {
            operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
          }
          pcVar9 = (char *)(**(code **)(*plVar8 + 0x10))(plVar8);
          std::__cxx11::string::string<std::allocator<char>>((string *)local_98,pcVar9,&local_a9);
          generateLogout(this,(string *)local_98);
          if ((Message *)local_98._0_8_ != message) {
            operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
          }
          disconnect(this);
        }
        else if (iVar3 == 2) {
          __cxa_begin_catch(local_a8);
          pFVar4 = FieldMap::getFieldRef(local_40,0x23);
          iVar3 = std::__cxx11::string::compare((char *)&pFVar4->m_string);
          if (iVar3 == 0) {
            nextLogout(this,message,now_03);
          }
          else {
            local_98._0_8_ = (Message *)(local_98 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_98,"Incorrect BeginString","");
            generateLogout(this,(string *)local_98);
            if ((Message *)local_98._0_8_ != (Message *)(local_98 + 0x10)) {
              operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
            }
            SessionState::incrNextTargetMsgSeqNum(&this->m_state);
          }
        }
        else {
          if (iVar3 != 1) {
            _Unwind_Resume(local_a8);
          }
          plVar8 = (long *)__cxa_begin_catch(local_a8);
          pcVar9 = (char *)(**(code **)(*plVar8 + 0x10))(plVar8);
          std::__cxx11::string::string<std::allocator<char>>((string *)local_98,pcVar9,&local_a9);
          SessionState::onEvent(&this->m_state,(string *)local_98);
          if ((Message *)local_98._0_8_ != (Message *)(local_98 + 0x10)) {
            operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
          }
          disconnect(this);
        }
      }
      __cxa_end_catch();
    }
    (*(this->m_timestamper)._M_invoker)((UtcTimeStamp *)local_98,(_Any_data *)&this->m_timestamper);
    next(this,(UtcTimeStamp *)local_98);
  }
  else {
    reset(this);
  }
  return;
}

Assistant:

void Session::next(const Message &message, const UtcTimeStamp &now, bool queued) {
  const Header &header = message.getHeader();

  try {
    if (!checkSessionTime(now)) {
      reset();
      return;
    }

    const MsgType &msgType = FIELD_GET_REF(header, MsgType);
    const BeginString &beginString = FIELD_GET_REF(header, BeginString);
    // make sure these fields are present
    FIELD_THROW_IF_NOT_FOUND(header, SenderCompID);
    FIELD_THROW_IF_NOT_FOUND(header, TargetCompID);

    if (beginString != m_sessionID.getBeginString()) {
      throw UnsupportedVersion();
    }

    if (msgType == MsgType_Logon) {
      if (m_sessionID.isFIXT()) {
        const DefaultApplVerID &applVerID = FIELD_GET_REF(message, DefaultApplVerID);
        setTargetDefaultApplVerID(applVerID);
      } else {
        setTargetDefaultApplVerID(Message::toApplVerID(beginString));
      }
    }

    const DataDictionary &sessionDataDictionary
        = m_dataDictionaryProvider.getSessionDataDictionary(m_sessionID.getBeginString());

    if (m_sessionID.isFIXT() && message.isApp()) {
      ApplVerID applVerID = m_targetDefaultApplVerID;
      header.getFieldIfSet(applVerID);
      const DataDictionary &applicationDataDictionary
          = m_dataDictionaryProvider.getApplicationDataDictionary(applVerID);
      DataDictionary::validate(message, &sessionDataDictionary, &applicationDataDictionary);
    } else {
      sessionDataDictionary.validate(message);
    }

    if (msgType == MsgType_Logon) {
      nextLogon(message, now);
    } else if (msgType == MsgType_Heartbeat) {
      nextHeartbeat(message, now);
    } else if (msgType == MsgType_TestRequest) {
      nextTestRequest(message, now);
    } else if (msgType == MsgType_SequenceReset) {
      nextSequenceReset(message, now);
    } else if (msgType == MsgType_Logout) {
      nextLogout(message, now);
    } else if (msgType == MsgType_ResendRequest) {
      nextResendRequest(message, now);
    } else if (msgType == MsgType_Reject) {
      nextReject(message, now);
    } else {
      if (!verify(message)) {
        return;
      }
      m_state.incrNextTargetMsgSeqNum();
    }
  } catch (MessageParseError &e) {
    m_state.onEvent(e.what());
  } catch (RequiredTagMissing &e) {
    LOGEX(generateReject(message, SessionRejectReason_REQUIRED_TAG_MISSING, e.field));
  } catch (FieldNotFound &e) {
    if (header.getField(FIELD::BeginString) >= FIX::BeginString_FIX42 && message.isApp()) {
      LOGEX(generateBusinessReject(message, BusinessRejectReason_CONDITIONALLY_REQUIRED_FIELD_MISSING, e.field));
    } else {
      LOGEX(generateReject(message, SessionRejectReason_REQUIRED_TAG_MISSING, e.field));
      if (header.getField(FIELD::MsgType) == MsgType_Logon) {
        m_state.onEvent("Required field missing from logon");
        disconnect();
      }
    }
  } catch (InvalidTagNumber &e) {
    LOGEX(generateReject(message, SessionRejectReason_INVALID_TAG_NUMBER, e.field));
  } catch (NoTagValue &e) {
    LOGEX(generateReject(message, SessionRejectReason_TAG_SPECIFIED_WITHOUT_A_VALUE, e.field));
  } catch (TagNotDefinedForMessage &e) {
    LOGEX(generateReject(message, SessionRejectReason_TAG_NOT_DEFINED_FOR_THIS_MESSAGE_TYPE, e.field));
  } catch (InvalidMessageType &) {
    LOGEX(generateReject(message, SessionRejectReason_INVALID_MSGTYPE));
  } catch (UnsupportedMessageType &) {
    if (header.getField(FIELD::BeginString) >= FIX::BeginString_FIX42) {
      LOGEX(generateBusinessReject(message, BusinessRejectReason_UNSUPPORTED_MESSAGE_TYPE));
    } else {
      LOGEX(generateReject(message, "Unsupported message type"));
    }
  } catch (TagOutOfOrder &e) {
    LOGEX(generateReject(message, SessionRejectReason_TAG_SPECIFIED_OUT_OF_REQUIRED_ORDER, e.field));
  } catch (IncorrectDataFormat &e) {
    LOGEX(generateReject(message, SessionRejectReason_INCORRECT_DATA_FORMAT_FOR_VALUE, e.field));
  } catch (IncorrectTagValue &e) {
    LOGEX(generateReject(message, SessionRejectReason_VALUE_IS_INCORRECT, e.field));
  } catch (RepeatedTag &e) {
    LOGEX(generateReject(message, SessionRejectReason_TAG_APPEARS_MORE_THAN_ONCE, e.field));
  } catch (RepeatingGroupCountMismatch &e) {
    LOGEX(generateReject(message, SessionRejectReason_INCORRECT_NUMINGROUP_COUNT_FOR_REPEATING_GROUP, e.field));
  } catch (InvalidMessage &e) {
    m_state.onEvent(e.what());
  } catch (RejectLogon &e) {
    m_state.onEvent(e.what());
    generateLogout(e.what());
    disconnect();
  } catch (UnsupportedVersion &) {
    if (header.getField(FIELD::MsgType) == MsgType_Logout) {
      nextLogout(message, now);
    } else {
      generateLogout("Incorrect BeginString");
      m_state.incrNextTargetMsgSeqNum();
    }
  } catch (IOException &e) {
    m_state.onEvent(e.what());
    disconnect();
  }

  if (!queued) {
    nextQueued(now);
  }

  if (isLoggedOn()) {
    next(m_timestamper());
  }
}